

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O1

XML_Convert_Result
unknown_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  unsigned_short *puVar1;
  XML_Convert_Result XVar2;
  unsigned_short uVar3;
  byte *pbVar5;
  bool bVar6;
  int iVar4;
  
  pbVar5 = (byte *)*fromP;
  bVar6 = fromLim <= pbVar5;
  if (!bVar6) {
    puVar1 = *toP;
    while (puVar1 < toLim) {
      uVar3 = *(unsigned_short *)((long)enc[3].literalScanners + (ulong)*pbVar5 * 2 + 0x30);
      if (uVar3 == 0) {
        iVar4 = (*enc[3].nameLength)((ENCODING *)enc[3].skipS,(char *)pbVar5);
        uVar3 = (unsigned_short)iVar4;
        pbVar5 = (byte *)(*fromP + ((ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) -
                                   3));
      }
      else {
        pbVar5 = pbVar5 + 1;
      }
      *fromP = (char *)pbVar5;
      puVar1 = *toP;
      *toP = puVar1 + 1;
      *puVar1 = uVar3;
      pbVar5 = (byte *)*fromP;
      bVar6 = fromLim <= pbVar5;
      if (bVar6) break;
      puVar1 = *toP;
    }
  }
  XVar2 = XML_CONVERT_COMPLETED;
  if (!bVar6) {
    XVar2 = (uint)(*toP == toLim) * 2;
  }
  return XVar2;
}

Assistant:

static enum XML_Convert_Result PTRCALL
unknown_toUtf16(const ENCODING *enc,
                const char **fromP, const char *fromLim,
                unsigned short **toP, const unsigned short *toLim)
{
  const struct unknown_encoding *uenc = AS_UNKNOWN_ENCODING(enc);
  while (*fromP < fromLim && *toP < toLim) {
    unsigned short c = uenc->utf16[(unsigned char)**fromP];
    if (c == 0) {
      c = (unsigned short)
          uenc->convert(uenc->userData, *fromP);
      *fromP += (AS_NORMAL_ENCODING(enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2));
    }
    else
      (*fromP)++;
    *(*toP)++ = c;
  }

  if ((*toP == toLim) && (*fromP < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}